

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O0

void * setsize_new(t_symbol *templatesym,t_symbol *fieldsym,t_floatarg newsize)

{
  t_object *owner;
  t_pd p_Var1;
  t_setsize *x;
  t_floatarg newsize_local;
  t_symbol *fieldsym_local;
  t_symbol *templatesym_local;
  
  owner = (t_object *)pd_new(setsize_class);
  p_Var1 = (t_pd)template_getbindsym(templatesym);
  owner[1].te_g.g_pd = p_Var1;
  owner[1].te_g.g_next = (_gobj *)fieldsym;
  gpointer_init((t_gpointer *)&owner[1].te_binbuf);
  pointerinlet_new(owner,(t_gpointer *)&owner[1].te_binbuf);
  return owner;
}

Assistant:

static void *setsize_new(t_symbol *templatesym, t_symbol *fieldsym,
    t_floatarg newsize)
{
    t_setsize *x = (t_setsize *)pd_new(setsize_class);
    x->x_templatesym = template_getbindsym(templatesym);
    x->x_fieldsym = fieldsym;
    gpointer_init(&x->x_gp);

    pointerinlet_new(&x->x_obj, &x->x_gp);
    return (x);
}